

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_rank(void **param_1)

{
  roaring64_bitmap_t *r;
  unsigned_long b;
  uint64_t uVar1;
  unsigned_long val;
  
  r = roaring64_bitmap_create();
  for (uVar1 = 0; uVar1 != 100000; uVar1 = uVar1 + 1000) {
    roaring64_bitmap_add(r,uVar1);
  }
  b = 1;
  val = b;
  for (; b != 0x65; b = b + 1) {
    uVar1 = roaring64_bitmap_rank(r,val - 1);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x232);
    uVar1 = roaring64_bitmap_rank(r,val);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x233);
    val = val + 1000;
  }
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_rank) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000), i + 1);
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000 + 1), i + 1);
    }
    roaring64_bitmap_free(r);
}